

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int mcpl2phits(char *inmcplfile,char *outphitsdumpfile,int use_polarisation,
              uint64_t nparticles_limit,int reclen)

{
  ulong uVar1;
  double dVar2;
  int reclen_00;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t lbuf;
  long lVar6;
  long in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  uint64_t remaining;
  int32_t rawtype;
  mcpl_particle_t *mcpl_p;
  double dumpdata [13];
  uint64_t skipped_nophitstype;
  uint64_t used;
  mcpl_generic_wfilehandle_t fout;
  mcpl_file_t fmcpl;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 local_c8 [4];
  mcpl_generic_wfilehandle_t *in_stack_ffffffffffffff40;
  ulong local_58;
  long local_50;
  long local_48 [3];
  undefined8 local_30;
  long local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((in_R8D != 4) && (in_R8D != 8)) {
    phits_error((char *)0x10393e);
  }
  local_30 = mcpl_open_file(local_8);
  uVar4 = mcpl_hdr_srcname(local_30);
  uVar5 = mcpl_hdr_nparticles(local_30);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",uVar4,uVar5);
  printf("Creating (or overwriting) output PHITS file.\n");
  mcpl_generic_wfopen(local_48);
  if (local_48[0] == 0) {
    phits_error((char *)0x1039c0);
  }
  local_50 = 0;
  local_58 = 0;
  printf("Initiating particle conversion loop.\n");
  memset(local_c8,0,0x68);
  do {
    while( true ) {
      lbuf = mcpl_read(local_30);
      if (lbuf == 0) goto LAB_00103c17;
      iVar3 = conv_code_pdg2phits((int32_t)in_stack_ffffffffffffff40);
      if (iVar3 != 0) break;
      local_58 = local_58 + 1;
      if ((local_58 < 0x65) &&
         (printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n"
                 ,(long)*(int *)(lbuf + 0x60)), local_58 == 100)) {
        printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
    }
    _local_c8 = (double)iVar3;
    in_stack_ffffffffffffff40 = *(mcpl_generic_wfilehandle_t **)(lbuf + 0x20);
    if (local_50 == 0x7fffffff) {
      printf(
            "WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump file - it is not known whether PHITS will be able to deal with such files correctly.\n"
            );
    }
    dVar2 = _local_c8;
    uVar1 = (ulong)_local_c8 >> 0x20;
    reclen_00 = (int)uVar1;
    _local_c8 = dVar2;
    phits_writerecord(in_stack_ffffffffffffff40,reclen_00,lbuf,
                      (char *)CONCAT44(iVar3,in_stack_ffffffffffffff28));
    local_50 = local_50 + 1;
  } while (local_50 != local_20);
  lVar6 = mcpl_hdr_nparticles(local_30);
  lVar6 = (lVar6 - local_58) - local_50;
  if (lVar6 != 0) {
    printf("Output limit of %llu particles reached. Ignoring remaining %llu particles in the MCPL file.\n"
           ,local_20,lVar6);
  }
LAB_00103c17:
  printf("Ending particle conversion loop.\n");
  if (local_58 != 0) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to PHITS codes.\n"
           ,local_58);
  }
  mcpl_close_file(local_30);
  mcpl_generic_fwclose(local_48);
  printf("Created %s with %lli particles.\n",local_10,local_50);
  return 1;
}

Assistant:

int mcpl2phits( const char * inmcplfile, const char * outphitsdumpfile,
                int use_polarisation, uint64_t nparticles_limit, int reclen )
{
  if ( reclen != 4 && reclen != 8 )
    phits_error("Reclen parameter should be 4 (32bit Fortran record markers,"
                " recommended) or 8 (64bit Fortran record markers)");

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  printf("Creating (or overwriting) output PHITS file.\n");

  //Open new phits file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen(outphitsdumpfile);

  if (!fout.internal)
    phits_error("Problems opening new PHITS file");

  uint64_t used = 0;
  uint64_t skipped_nophitstype = 0;

  printf("Initiating particle conversion loop.\n");

  double dumpdata[13] = {0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.};//explicit since gcc 4.1-4.6 might warn on ={0}; syntax

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if ( !mcpl_p )
      break;
    int32_t rawtype =  conv_code_pdg2phits( mcpl_p->pdgcode );
    if (!rawtype) {
      ++skipped_nophitstype;
      if (skipped_nophitstype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n",
               (long)mcpl_p->pdgcode);
        if (skipped_nophitstype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    assert(rawtype!=0);

    dumpdata[0] = rawtype;
    dumpdata[1] = mcpl_p->position[0];//Already in cm
    dumpdata[2] = mcpl_p->position[1];//Already in cm
    dumpdata[3] = mcpl_p->position[2];//Already in cm
    dumpdata[4] = mcpl_p->direction[0];
    dumpdata[5] = mcpl_p->direction[1];
    dumpdata[6] = mcpl_p->direction[2];
    dumpdata[7] = mcpl_p->ekin;//Already in MeV
    dumpdata[8] = mcpl_p->weight;
    dumpdata[9] = mcpl_p->time * 1.0e6;//ms->ns
    dumpdata[10] = mcpl_p->polarisation[0];
    dumpdata[11] = mcpl_p->polarisation[1];
    dumpdata[12] = mcpl_p->polarisation[2];

    if (used==INT32_MAX) {
      printf("WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump "
             "file - it is not known whether PHITS will be able to deal with such files correctly.\n");
    }
    phits_writerecord(&fout,reclen,sizeof(double)*(use_polarisation?13:10),(char*)&dumpdata[0]);

    if (++used==nparticles_limit) {
      uint64_t remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nophitstype - used;
      if (remaining)
        printf("Output limit of %llu particles reached. Ignoring"
               " remaining %llu particles in the MCPL file.\n",
               (unsigned long long)nparticles_limit,
               (unsigned long long)remaining );
      break;
    }


  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nophitstype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to PHITS codes.\n",(long long)skipped_nophitstype);
  }
  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles.\n",outphitsdumpfile,(long long)used);

  return 1;


}